

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser_error parse_artifact_cost(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  void *pvVar3;
  object_kind *poVar4;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    poVar4 = lookup_kind(*(wchar_t *)((long)pvVar3 + 0x20),*(wchar_t *)((long)pvVar3 + 0x24));
    if (poVar4 == (object_kind *)0x0) {
      __assert_fail("k",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-init.c"
                    ,0xae5,"enum parser_error parse_artifact_cost(struct parser *)");
    }
    wVar1 = parser_getint(p,"cost");
    *(wchar_t *)((long)pvVar3 + 0x44) = wVar1;
    pVar2 = PARSE_ERROR_NONE;
    if ((uint)z_info->ordinary_kind_max <= poVar4->kidx) {
      poVar4->cost = wVar1;
    }
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_artifact_cost(struct parser *p) {
	struct artifact *a = parser_priv(p);
	struct object_kind *k;

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	k = lookup_kind(a->tval, a->sval);
	assert(k);
	a->cost = parser_getint(p, "cost");
	/* Set kind cost for special artifacts */
	if (k->kidx >= z_info->ordinary_kind_max) {
		k->cost = a->cost;
	}
	return PARSE_ERROR_NONE;
}